

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

SubTypeAccess * __thiscall
glu::SubTypeAccess::element(SubTypeAccess *__return_storage_ptr__,SubTypeAccess *this,int ndx)

{
  SubTypeAccess *pSVar1;
  SubTypeAccess SStack_48;
  
  SubTypeAccess(&SStack_48,this);
  pSVar1 = element(&SStack_48,ndx);
  SubTypeAccess(__return_storage_ptr__,pSVar1);
  ~SubTypeAccess(&SStack_48);
  return __return_storage_ptr__;
}

Assistant:

SubTypeAccess				element				(int ndx) const { return SubTypeAccess(*this).element(ndx);		}